

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::check_absent_keys<int>
          (tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,initializer_list<int> absent_keys)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  int *piVar4;
  char *message;
  ulong uVar5;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  unique_lock<std::mutex> local_60;
  int *local_50;
  mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_48;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_40;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_38;
  
  piVar4 = absent_keys._M_array;
  if (absent_keys._M_len != 0) {
    local_50 = piVar4 + absent_keys._M_len;
    p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
    local_48 = &this->test_db;
    do {
      uVar5 = (ulong)*piVar4;
      p_Var2 = (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
          p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < uVar5]) {
        if (*(ulong *)(p_Var2 + 1) >= uVar5) {
          p_Var3 = p_Var2;
        }
      }
      local_40._M_node = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
         (local_40._M_node = p_Var3, uVar5 < *(ulong *)(p_Var3 + 1))) {
        local_40._M_node = &p_Var1->_M_header;
      }
      local_38._M_node = &p_Var1->_M_header;
      testing::internal::
      CmpHelperEQ<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>,std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>>
                ((internal *)local_78,"(values.find(to_ikey(k)))","(values.cend())",&local_40,
                 &local_38);
      if (local_78[0] == '\0') {
        testing::Message::Message((Message *)&local_40);
        if (gtest_ar._0_8_ == 0) {
          message = "";
        }
        else {
          message = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,0x288,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_40);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
        if (local_40._M_node != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_40._M_node + 8))();
        }
        if (gtest_ar._0_8_ == 0) {
          return;
        }
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
        return;
      }
      if (gtest_ar._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
      }
      mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_internal
                ((pair<std::optional<std::span<const_std::byte,_18446744073709551615UL>_>,_std::unique_lock<std::mutex>_>
                  *)local_78,local_48,
                 (art_key_type)
                 (uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                  (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                  (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28
                 | uVar5 << 0x38));
      std::unique_lock<std::mutex>::~unique_lock(&local_60);
      piVar4 = piVar4 + 1;
    } while (piVar4 != local_50);
  }
  return;
}

Assistant:

void check_absent_keys(std::initializer_list<T> absent_keys) noexcept(
      noexcept(this->try_get(coerce_key(*absent_keys.begin())))) {
    for (const auto absent_key : absent_keys) {
      const auto k{coerce_key(absent_key)};
      UNODB_ASSERT_EQ(values.find(to_ikey(k)), values.cend());
      try_get(k);
    }
  }